

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

Float __thiscall pbrt::Vertex::ConvertDensity(Vertex *this,Float pdf,Vertex *next)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  type tVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 in_XMM4 [16];
  Point3f PVar15;
  Point3f PVar16;
  Tuple3<pbrt::Vector3,_float> local_20;
  undefined1 auVar13 [56];
  
  auVar13 = in_register_00001204._4_56_;
  bVar7 = IsInfiniteLight(next);
  fVar9 = pdf;
  if (!bVar7) {
    PVar15 = Interaction::p(&(next->field_2).ei.super_Interaction);
    auVar11._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar13;
    PVar16 = Interaction::p(&(this->field_2).ei.super_Interaction);
    auVar12._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar13;
    auVar14 = vsubps_avx(auVar11._0_16_,auVar12._0_16_);
    fVar6 = PVar15.super_Tuple3<pbrt::Point3,_float>.z - PVar16.super_Tuple3<pbrt::Point3,_float>.z;
    fVar2 = auVar14._0_4_;
    auVar10._0_4_ = fVar2 * fVar2;
    fVar3 = auVar14._4_4_;
    auVar10._4_4_ = fVar3 * fVar3;
    fVar4 = auVar14._8_4_;
    auVar10._8_4_ = fVar4 * fVar4;
    fVar5 = auVar14._12_4_;
    auVar10._12_4_ = fVar5 * fVar5;
    auVar14 = vhaddps_avx(auVar10,auVar10);
    fVar1 = fVar6 * fVar6 + auVar14._0_4_;
    if ((fVar1 != 0.0) || (fVar9 = 0.0, NAN(fVar1))) {
      bVar7 = IsOnSurface(next);
      if (bVar7) {
        auVar14 = vsqrtss_avx(in_XMM4,ZEXT416((uint)(1.0 / fVar1)));
        local_20.z = auVar14._0_4_;
        auVar14._0_4_ = local_20.z * fVar2;
        auVar14._4_4_ = local_20.z * fVar3;
        auVar14._8_4_ = local_20.z * fVar4;
        auVar14._12_4_ = local_20.z * fVar5;
        local_20.z = local_20.z * fVar6;
        local_20._0_8_ = vmovlps_avx(auVar14);
        tVar8 = AbsDot<float>(&(next->field_2).ei.super_Interaction.n,(Vector3<float> *)&local_20);
        pdf = tVar8 * pdf;
      }
      fVar9 = pdf * (1.0 / fVar1);
    }
  }
  return fVar9;
}

Assistant:

Float ConvertDensity(Float pdf, const Vertex &next) const {
        // Return solid angle density if _next_ is an infinite area light
        if (next.IsInfiniteLight())
            return pdf;

        Vector3f w = next.p() - p();
        if (LengthSquared(w) == 0)
            return 0;
        Float invDist2 = 1 / LengthSquared(w);
        if (next.IsOnSurface())
            pdf *= AbsDot(next.ng(), w * std::sqrt(invDist2));
        return pdf * invDist2;
    }